

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_completed_queue.cpp
# Opt level: O2

void __thiscall libtorrent::aux::disk_completed_queue::call_job_handlers(disk_completed_queue *this)

{
  disk_job *pdVar1;
  disk_job *this_00;
  disk_job *j;
  unique_lock<std::mutex> l;
  static_vector<libtorrent::aux::disk_job_*,_64UL,_void> to_delete;
  
  counters::inc_stats_counter(this->m_stats_counters,0x41,1);
  ::std::unique_lock<std::mutex>::unique_lock(&l,&this->m_completed_jobs_mutex);
  this->m_job_completions_in_flight = false;
  this_00 = (this->m_completed_jobs).m_first;
  (this->m_completed_jobs).m_first = (disk_job *)0x0;
  (this->m_completed_jobs).m_last = (disk_job *)0x0;
  (this->m_completed_jobs).m_size = 0;
  j = this_00;
  ::std::unique_lock<std::mutex>::unlock(&l);
  to_delete.
  super_vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  while (this_00 != (disk_job *)0x0) {
    pdVar1 = (this_00->super_tailqueue_node<libtorrent::aux::disk_job>).next;
    disk_job::call_callback(this_00);
    boost::container::
    vector<libtorrent::aux::disk_job*,boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job*,64ul,0ul,true>,void>
    ::priv_push_back<libtorrent::aux::disk_job*const&>
              ((vector<libtorrent::aux::disk_job*,boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job*,64ul,0ul,true>,void>
                *)&to_delete,&j);
    this_00 = pdVar1;
    j = pdVar1;
    if (to_delete.
        super_vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
        .m_holder.m_size == 0x40) {
      ::std::function<void_(libtorrent::aux::disk_job_**,_int)>::operator()
                (&this->m_free_jobs,(disk_job **)&to_delete,0x40);
      to_delete.
      super_vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
      .m_holder.m_size = 0;
      this_00 = j;
    }
  }
  if (to_delete.
      super_vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
      .m_holder.m_size != 0) {
    ::std::function<void_(libtorrent::aux::disk_job_**,_int)>::operator()
              (&this->m_free_jobs,(disk_job **)&to_delete,
               (int)to_delete.
                    super_vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                    .m_holder.m_size);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&l);
  return;
}

Assistant:

void disk_completed_queue::call_job_handlers()
{
	m_stats_counters.inc_stats_counter(counters::on_disk_counter);
	std::unique_lock<std::mutex> l(m_completed_jobs_mutex);

	DLOG("call_job_handlers (%d)\n", m_completed_jobs.size());

	TORRENT_ASSERT(m_job_completions_in_flight);
	m_job_completions_in_flight = false;

	auto* j = static_cast<aux::disk_job*>(m_completed_jobs.get_all());
	l.unlock();

	boost::container::static_vector<aux::disk_job*, 64> to_delete;

	while (j)
	{
		TORRENT_ASSERT(j->job_posted == true);
		TORRENT_ASSERT(j->callback_called == false);
		DLOG("   callback: %s\n", print_job(*j).c_str());
		auto* next = static_cast<aux::disk_job*>(j->next);

#if TORRENT_USE_ASSERTS
		j->callback_called = true;
#endif
		j->call_callback();
		to_delete.push_back(j);
		j = next;
		if (to_delete.size() == to_delete.capacity())
		{
			m_free_jobs(to_delete.data(), int(to_delete.size()));
			to_delete.clear();
		}
	}

	if (!to_delete.empty()) m_free_jobs(to_delete.data(), int(to_delete.size()));
}